

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_comparison_expression.cpp
# Opt level: O2

bool duckdb::BoundComparisonExpression::TryBindComparison
               (ClientContext *context,LogicalType *left_type,LogicalType *right_type,
               LogicalType *result_type,ExpressionType comparison_type)

{
  bool bVar1;
  reference this;
  BinderException *this_00;
  LogicalType *extraout_RDX;
  LogicalType *type;
  LogicalType *extraout_RDX_00;
  LogicalType *type_00;
  byte bVar2;
  long lVar3;
  byte scale_00;
  undefined3 in_register_00000081;
  ulong __n;
  byte bVar4;
  initializer_list<duckdb::LogicalType> __l;
  allocator local_c1;
  LogicalType res;
  uint8_t width;
  element_type *local_a0;
  LogicalType local_90;
  LogicalType *local_78;
  vector<duckdb::LogicalType,_true> argument_types;
  uint8_t scale;
  
  LogicalType::LogicalType(&res);
  if ((CONCAT31(in_register_00000081,comparison_type) < 0x29) &&
     ((0x13806000000U >> ((ulong)CONCAT31(in_register_00000081,comparison_type) & 0x3f) & 1) != 0))
  {
    LogicalType::ForceMaxLogicalType((LogicalType *)&width,left_type,right_type);
    LogicalType::operator=(&res,(LogicalType *)&width);
    LogicalType::~LogicalType((LogicalType *)&width);
    type = extraout_RDX;
  }
  else {
    bVar1 = LogicalType::TryGetMaxLogicalType(context,left_type,right_type,&res);
    type = extraout_RDX_00;
    if (!bVar1) {
      bVar1 = false;
      goto LAB_015ea154;
    }
  }
  if (res.id_ == VARCHAR) {
    if (((ulong)left_type->id_ < 0x33) &&
       ((0x60045f8fffc00U >> ((ulong)left_type->id_ & 0x3f) & 1) != 0)) {
      LogicalType::NormalizeType((LogicalType *)&width,left_type);
    }
    else {
      if ((0x32 < (ulong)right_type->id_) ||
         ((0x60045f8fffc00U >> ((ulong)right_type->id_ & 0x3f) & 1) == 0)) {
        StringType::GetCollation_abi_cxx11_((string *)&width,(StringType *)left_type,type);
        StringType::GetCollation_abi_cxx11_
                  ((string *)&argument_types,(StringType *)right_type,type_00);
        if ((local_a0 != (element_type *)0x0) &&
           (argument_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
            super__Vector_impl_data._M_finish != (pointer)0x0)) {
          bVar1 = ::std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&width,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&argument_types);
          if (bVar1) {
            this_00 = (BinderException *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&scale,"Cannot combine types with different collation!",&local_c1);
            BinderException::BinderException(this_00,(string *)&scale);
            __cxa_throw(this_00,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
          }
        }
        ::std::__cxx11::string::~string((string *)&argument_types);
        ::std::__cxx11::string::~string((string *)&width);
        goto LAB_015ea145;
      }
      LogicalType::NormalizeType((LogicalType *)&width,right_type);
    }
    LogicalType::operator=(&res,(LogicalType *)&width);
    LogicalType::~LogicalType((LogicalType *)&width);
  }
  else if (res.id_ == DECIMAL) {
    LogicalType::LogicalType((LogicalType *)&width,left_type);
    LogicalType::LogicalType(&local_90,right_type);
    __l._M_len = 2;
    __l._M_array = (iterator)&width;
    local_78 = result_type;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
              (&argument_types.
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,__l,
               (allocator_type *)&scale);
    lVar3 = 0x18;
    do {
      LogicalType::~LogicalType((LogicalType *)(&width + lVar3));
      lVar3 = lVar3 + -0x18;
    } while (lVar3 != -0x18);
    bVar2 = 0;
    scale_00 = 0;
    bVar4 = 0;
    __n = 0;
    while( true ) {
      if ((ulong)(((long)argument_types.
                         super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                         super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)argument_types.
                        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= __n) break;
      this = vector<duckdb::LogicalType,_true>::get<true>(&argument_types,__n);
      bVar1 = LogicalType::GetDecimalProperties(this,&width,&scale);
      if (!bVar1) {
        LogicalType::operator=(local_78,&res);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                  (&argument_types.
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
        goto LAB_015ea152;
      }
      if (bVar2 < width) {
        bVar2 = width;
      }
      if (scale_00 < scale) {
        scale_00 = scale;
      }
      if (bVar4 < (byte)(width - scale)) {
        bVar4 = width - scale;
      }
      __n = __n + 1;
    }
    if (bVar2 < (byte)(bVar4 + scale_00)) {
      bVar2 = bVar4 + scale_00;
    }
    bVar4 = 0x26;
    if (bVar2 < 0x26) {
      bVar4 = bVar2;
    }
    LogicalType::DECIMAL((LogicalType *)&width,bVar4,scale_00);
    LogicalType::operator=(&res,(LogicalType *)&width);
    LogicalType::~LogicalType((LogicalType *)&width);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              (&argument_types.
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
    result_type = local_78;
  }
LAB_015ea145:
  LogicalType::operator=(result_type,&res);
LAB_015ea152:
  bVar1 = true;
LAB_015ea154:
  LogicalType::~LogicalType(&res);
  return bVar1;
}

Assistant:

bool BoundComparisonExpression::TryBindComparison(ClientContext &context, const LogicalType &left_type,
                                                  const LogicalType &right_type, LogicalType &result_type,
                                                  ExpressionType comparison_type) {
	LogicalType res;
	bool is_equality;
	switch (comparison_type) {
	case ExpressionType::COMPARE_EQUAL:
	case ExpressionType::COMPARE_NOTEQUAL:
	case ExpressionType::COMPARE_IN:
	case ExpressionType::COMPARE_NOT_IN:
	case ExpressionType::COMPARE_DISTINCT_FROM:
	case ExpressionType::COMPARE_NOT_DISTINCT_FROM:
		is_equality = true;
		break;
	default:
		is_equality = false;
		break;
	}
	if (is_equality) {
		res = LogicalType::ForceMaxLogicalType(left_type, right_type);
	} else {
		if (!LogicalType::TryGetMaxLogicalType(context, left_type, right_type, res)) {
			return false;
		}
	}
	switch (res.id()) {
	case LogicalTypeId::DECIMAL: {
		// result is a decimal: we need the maximum width and the maximum scale over width
		vector<LogicalType> argument_types = {left_type, right_type};
		uint8_t max_width = 0, max_scale = 0, max_width_over_scale = 0;
		for (idx_t i = 0; i < argument_types.size(); i++) {
			uint8_t width, scale;
			auto can_convert = argument_types[i].GetDecimalProperties(width, scale);
			if (!can_convert) {
				result_type = res;
				return true;
			}
			max_width = MaxValue<uint8_t>(width, max_width);
			max_scale = MaxValue<uint8_t>(scale, max_scale);
			max_width_over_scale = MaxValue<uint8_t>(width - scale, max_width_over_scale);
		}
		max_width = MaxValue<uint8_t>(max_scale + max_width_over_scale, max_width);
		if (max_width > Decimal::MAX_WIDTH_DECIMAL) {
			// target width does not fit in decimal: truncate the scale (if possible) to try and make it fit
			max_width = Decimal::MAX_WIDTH_DECIMAL;
		}
		res = LogicalType::DECIMAL(max_width, max_scale);
		break;
	}
	case LogicalTypeId::VARCHAR:
		// for comparison with strings, we prefer to bind to the numeric types
		if (left_type.id() != LogicalTypeId::VARCHAR && SwitchVarcharComparison(left_type)) {
			res = LogicalType::NormalizeType(left_type);
		} else if (right_type.id() != LogicalTypeId::VARCHAR && SwitchVarcharComparison(right_type)) {
			res = LogicalType::NormalizeType(right_type);
		} else {
			// else: check if collations are compatible
			auto left_collation = StringType::GetCollation(left_type);
			auto right_collation = StringType::GetCollation(right_type);
			if (!left_collation.empty() && !right_collation.empty() && left_collation != right_collation) {
				throw BinderException("Cannot combine types with different collation!");
			}
		}
		break;
	default:
		break;
	}
	result_type = res;
	return true;
}